

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

value_type __thiscall QList<QItemSelectionRange>::takeLast(QList<QItemSelectionRange> *this)

{
  qsizetype *pqVar1;
  QItemSelectionRange *pQVar2;
  long lVar3;
  QPersistentModelIndexData *pQVar4;
  iterator iVar5;
  QPersistentModelIndex extraout_RDX;
  QList<QItemSelectionRange> *in_RSI;
  value_type vVar6;
  
  (this->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (this->d).ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  iVar5 = end(in_RSI);
  pQVar4 = iVar5.i[-1].tl.d;
  pQVar2 = (QItemSelectionRange *)iVar5.i[-1].br.d;
  iVar5.i[-1].tl.d = (QPersistentModelIndexData *)0x0;
  iVar5.i[-1].br.d = (QPersistentModelIndexData *)0x0;
  (this->d).d = (Data *)pQVar4;
  (this->d).ptr = pQVar2;
  pQVar2 = (in_RSI->d).ptr;
  lVar3 = (in_RSI->d).size;
  QPersistentModelIndex::~QPersistentModelIndex(&pQVar2[lVar3 + -1].br);
  QPersistentModelIndex::~QPersistentModelIndex(&pQVar2[lVar3 + -1].tl);
  pqVar1 = &(in_RSI->d).size;
  *pqVar1 = *pqVar1 + -1;
  vVar6.br.d = extraout_RDX.d;
  vVar6.tl.d = (QPersistentModelIndexData *)this;
  return vVar6;
}

Assistant:

value_type takeLast() { Q_ASSERT(!isEmpty()); value_type v = std::move(last()); d->eraseLast(); return v; }